

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O0

SelectionSet * __thiscall OpenMD::SelectionSet::parallelReduce(SelectionSet *this)

{
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *in_RSI;
  OpenMDBitSet *in_RDI;
  OpenMDBitSet *in_stack_00000028;
  int i;
  SelectionSet *result;
  OpenMDBitSet *this_00;
  SelectionSet *in_stack_ffffffffffffffb0;
  undefined4 local_18;
  
  this_00 = in_RDI;
  SelectionSet(in_stack_ffffffffffffffb0);
  for (local_18 = 0; local_18 < 6; local_18 = local_18 + 1) {
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              (in_RSI,(long)local_18);
    OpenMDBitSet::parallelReduce(in_stack_00000028);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)in_RDI,
               (long)local_18);
    OpenMDBitSet::operator=(this_00,in_RDI);
    OpenMDBitSet::~OpenMDBitSet((OpenMDBitSet *)0x37dd90);
  }
  return (SelectionSet *)this_00;
}

Assistant:

SelectionSet SelectionSet::parallelReduce() {
    SelectionSet result;
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result.bitsets_[i] = bitsets_[i].parallelReduce();

    return result;
  }